

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O0

int msg_write(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong local_30;
  size_t total;
  ssize_t bytes;
  size_t count_local;
  void *buf_local;
  int fd_local;
  
  local_30 = 0;
  do {
    sVar1 = write(fd,(void *)((long)buf + local_30),count - local_30);
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xb) goto LAB_001070f4;
      usleep(50000);
    }
    else {
      if (sVar1 == 0) {
        perror("write");
        return -1;
      }
LAB_001070f4:
      local_30 = sVar1 + local_30;
    }
    if (count <= local_30) {
      return (int)local_30;
    }
  } while( true );
}

Assistant:

static int msg_write(int fd, void *buf, size_t count)
{
    ssize_t bytes;
    size_t total = 0;

    do {
#ifdef _WIN32
        bytes = send(fd, (uint8_t *)buf + total, count - total, 0);
#else
        bytes = write(fd, (uint8_t *)buf + total, count - total);
#endif
        if (bytes == -1) {
            if (errno == EAGAIN) {
                /*
                 * This could happen, since this function goal is not to
                 * return until all data have been read, just sleep a little
                 * bit (0.05 seconds)
                 */

#ifdef _WIN32
                Sleep(5);
#else
                usleep(50000);
#endif
                continue;
            }
        }
        else if (bytes == 0) {
            /* Broken pipe ? */
            perror("write");
            return -1;
        }
        total += bytes;

    } while (total < count);

    return total;
}